

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

void Cec_ManSimProcessRefined(Cec_ManSim_t *p,Vec_Int_t *vRefined)

{
  int iVar1;
  int nWords;
  uint *puVar2;
  Gia_Man_t *pGVar3;
  Gia_Rpr_t *pGVar4;
  uint uVar5;
  int iVar6;
  void *__ptr;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  Gia_Rpr_t GVar11;
  uint uVar12;
  uint nTableSize;
  
  iVar1 = vRefined->nSize;
  if (iVar1 != 0) {
    uVar12 = iVar1 / 3 + 99;
    while( true ) {
      do {
        nTableSize = uVar12 + 1;
        uVar5 = uVar12 & 1;
        uVar12 = nTableSize;
      } while (uVar5 != 0);
      if (nTableSize < 9) break;
      iVar8 = 5;
      while (nTableSize % (iVar8 - 2U) != 0) {
        uVar5 = iVar8 * iVar8;
        iVar8 = iVar8 + 2;
        if (nTableSize < uVar5) goto LAB_006464b1;
      }
    }
LAB_006464b1:
    __ptr = calloc((long)(int)nTableSize,4);
    if (0 < iVar1) {
      lVar10 = 0;
      do {
        iVar1 = vRefined->pArray[lVar10];
        puVar2 = p->pMems;
        iVar8 = p->pSimInfo[iVar1];
        nWords = p->nWords;
        iVar6 = Cec_ManSimCompareConst(puVar2 + (long)iVar8 + 1,nWords);
        if (iVar6 != 0) {
          __assert_fail("!Cec_ManSimCompareConst( pSim, p->nWords )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                        ,0x1de,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
        }
        iVar8 = Cec_ManSimHashKey(puVar2 + (long)iVar8 + 1,nWords,nTableSize);
        uVar12 = *(uint *)((long)__ptr + (long)iVar8 * 4);
        lVar9 = (long)(int)uVar12;
        pGVar3 = p->pAig;
        if (lVar9 == 0) {
          GVar11 = pGVar3->pReprs[iVar1];
          if (((uint)GVar11 & 0xfffffff) != 0) {
            __assert_fail("Gia_ObjRepr(p->pAig, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                          ,0x1e2,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
          }
          if (pGVar3->pNexts[iVar1] != 0) {
            __assert_fail("Gia_ObjNext(p->pAig, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                          ,0x1e3,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
          }
          pGVar3->pReprs[iVar1] = (Gia_Rpr_t)((uint)GVar11 | 0xfffffff);
        }
        else {
          pGVar3->pNexts[lVar9] = iVar1;
          pGVar4 = pGVar3->pReprs;
          uVar5 = (uint)pGVar4[lVar9] & 0xfffffff;
          if ((uVar5 != 0xfffffff) && (iVar1 <= (int)uVar5)) {
LAB_006466dc:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          pGVar4[iVar1] = (Gia_Rpr_t)((uint)pGVar4[iVar1] & 0xf0000000 | uVar5);
          pGVar4 = p->pAig->pReprs;
          GVar11 = pGVar4[iVar1];
          if ((~(uint)GVar11 & 0xfffffff) == 0) {
            if ((uVar12 != 0xfffffff) && (iVar1 <= (int)uVar12)) goto LAB_006466dc;
            pGVar4[iVar1] = (Gia_Rpr_t)((uint)GVar11 & 0xf0000000 | uVar12 & 0xfffffff);
            GVar11 = p->pAig->pReprs[iVar1];
          }
          if (((uint)GVar11 & 0xfffffff) == 0) {
            __assert_fail("Gia_ObjRepr(p->pAig, i) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                          ,0x1ec,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
          }
        }
        *(int *)((long)__ptr + (long)iVar8 * 4) = iVar1;
        lVar10 = lVar10 + 1;
        uVar7 = (ulong)vRefined->nSize;
      } while (lVar10 < (long)uVar7);
      if (vRefined->nSize < 1) goto LAB_00646698;
      lVar10 = 0;
      do {
        iVar1 = vRefined->pArray[lVar10];
        if (((~(uint)p->pAig->pReprs[iVar1] & 0xfffffff) == 0) && (0 < p->pAig->pNexts[iVar1])) {
          Cec_ManSimClassRefineOne(p,iVar1);
          uVar7 = (ulong)(uint)vRefined->nSize;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)uVar7);
      if (0 < (int)uVar7) {
        lVar10 = 0;
        do {
          Cec_ManSimSimDeref(p,vRefined->pArray[lVar10]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < vRefined->nSize);
      }
    }
    if (__ptr != (void *)0x0) {
LAB_00646698:
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void Cec_ManSimProcessRefined( Cec_ManSim_t * p, Vec_Int_t * vRefined )
{
    unsigned * pSim;
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 100 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        pSim = Cec_ObjSim( p, i );
        assert( !Cec_ManSimCompareConst( pSim, p->nWords ) );
        Key = Cec_ManSimHashKey( pSim, p->nWords, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p->pAig, i) == 0 );
            assert( Gia_ObjNext(p->pAig, i) == 0 );
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p->pAig, pTable[Key], i );
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjRepr(p->pAig, pTable[Key]) );
            if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID )
                Gia_ObjSetRepr( p->pAig, i, pTable[Key] );
            assert( Gia_ObjRepr(p->pAig, i) > 0 );
        }
        pTable[Key] = i;
    }
    Vec_IntForEachEntry( vRefined, i, k )
    {
        if ( Gia_ObjIsHead( p->pAig, i ) )
            Cec_ManSimClassRefineOne( p, i );
    }
    Vec_IntForEachEntry( vRefined, i, k )
        Cec_ManSimSimDeref( p, i );
    ABC_FREE( pTable );
}